

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

SpecifyBlockSymbol *
slang::ast::SpecifyBlockSymbol::fromSyntax
          (Scope *scope,SpecifyBlockSyntax *syntax,
          SmallVector<const_slang::ast::Symbol_*,_5UL> *implicitSymbols)

{
  char *pcVar1;
  SyntaxKind SVar2;
  Compilation *args;
  pointer ppMVar3;
  size_t sVar4;
  Symbol *args_00;
  SourceLocation SVar5;
  SyntaxNode *pSVar6;
  int iVar7;
  bool bVar8;
  undefined1 uVar9;
  uint uVar10;
  SpecifyBlockSymbol *pSVar11;
  NetType *netType;
  TimingCheckArgSyntax *pTVar12;
  uint64_t hash;
  ulong uVar13;
  Symbol *pSVar14;
  Symbol **ppSVar15;
  Scope *pSVar16;
  long lVar17;
  long lVar18;
  TimingCheckEventArgSyntax *eventArg;
  SyntaxNode *pSVar19;
  size_t i;
  Symbol *index;
  Scope *pos0;
  undefined1 auVar20 [16];
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  string_view local_1f0;
  Compilation *local_1e0;
  SourceLocation local_1d8;
  Scope *local_1d0;
  Symbol *local_1c8;
  ulong local_1c0;
  SyntaxNode *local_1b8;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  NetSymbol *local_170 [3];
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_150;
  undefined1 uStack_14f;
  undefined1 uStack_14e;
  undefined1 uStack_14d;
  undefined1 uStack_14c;
  undefined1 uStack_14b;
  undefined1 uStack_14a;
  undefined1 uStack_149;
  undefined1 local_148;
  undefined1 uStack_147;
  undefined1 uStack_146;
  undefined1 uStack_145;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  undefined1 uStack_141;
  undefined1 uStack_140;
  undefined1 uStack_13f;
  undefined1 uStack_13e;
  undefined1 uStack_13d;
  undefined1 uStack_13c;
  undefined1 uStack_13b;
  undefined1 uStack_13a;
  undefined1 uStack_139;
  Scope *local_130;
  undefined4 local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined8 local_100;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  
  args = scope->compilation;
  implicitNetNames.super_Storage.buffer._0_8_ = parsing::Token::location(&syntax->specify);
  local_1e0 = args;
  pSVar11 = BumpAllocator::
            emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
                      (&args->super_BumpAllocator,args,(SourceLocation *)&implicitNetNames);
  (pSVar11->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  ppMVar3 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr
  ;
  sVar4 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar17 = 0; sVar4 << 3 != lVar17; lVar17 = lVar17 + 8) {
    Scope::addMembers(&pSVar11->super_Scope,*(SyntaxNode **)((long)ppMVar3 + lVar17));
  }
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(&implicitNetNames);
  ppSVar15 = &(pSVar11->super_Scope).firstMember;
  do {
    args_00 = *ppSVar15;
    if (args_00 == (Symbol *)0x0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     *)&implicitNetNames.super_Storage.field_0x88);
      return pSVar11;
    }
    if (args_00->kind == SystemTimingCheck) {
      SVar5 = args_00[1].location;
      netType = Scope::getDefaultNetType(scope);
      if ((SVar5 != (SourceLocation)0x0) && (netType->netKind != Unknown)) {
        pSVar19 = args_00->originatingSyntax;
        local_128 = 0xffffffff;
        local_110 = (undefined1  [16])0x0;
        local_100._0_4_ = 0;
        local_100._4_4_ = 0;
        implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
             (pointer)implicitNets.
                      super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.
                      firstElement;
        implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len = 0;
        local_120 = (undefined1  [16])0x0;
        implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.cap = 5;
        lVar17 = 0;
        pSVar14 = args_00;
        local_130 = scope;
        for (index = (Symbol *)0x0;
            (index < (Symbol *)((ulong)((long)&(pSVar19[6].previewNode)->kind + 1) >> 1) &&
            (lVar18 = *(long *)((long)SVar5 + 0x10),
            index < (Symbol *)(*(long *)((long)SVar5 + 0x18) - lVar18 >> 4)));
            index = (Symbol *)
                    ((long)&((not_null<const_slang::ast::Scope_*> *)&index->kind)->ptr + 1)) {
          pSVar14 = index;
          pTVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::
                    operator[]((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                               &pSVar19[4].previewNode,(size_t)index);
          uVar10 = *(uint *)(lVar18 + lVar17);
          if ((uVar10 < 5) && ((0x15U >> (uVar10 & 0x1f) & 1) != 0)) {
            SVar2 = (pTVar12->super_SyntaxNode).kind;
            if (SVar2 == TimingCheckEventArg) {
              pSVar14 = (Symbol *)&local_130;
              Expression::findPotentiallyImplicitNets
                        (*(SyntaxNode **)&pTVar12[2].super_SyntaxNode,(ASTContext *)pSVar14,
                         &implicitNets.
                          super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>);
              pSVar6 = pTVar12[2].super_SyntaxNode.parent;
              if (pSVar6 != (SyntaxNode *)0x0) {
                pSVar14 = (Symbol *)&local_130;
                Expression::findPotentiallyImplicitNets
                          (pSVar6[1].previewNode,(ASTContext *)pSVar14,
                           &implicitNets.
                            super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>);
              }
            }
            else if (SVar2 == ExpressionTimingCheckArg) {
              pSVar14 = (Symbol *)&local_130;
              Expression::findPotentiallyImplicitNets
                        (*(SyntaxNode **)&pTVar12[1].super_SyntaxNode,(ASTContext *)pSVar14,
                         &implicitNets.
                          super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>);
            }
          }
          lVar17 = lVar17 + 0x10;
        }
        local_1d8 = (SourceLocation)local_130->compilation;
        local_1b8 = (SyntaxNode *)
                    (implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>
                     .data_ + implicitNets.
                              super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len
                    );
        for (pSVar19 = (SyntaxNode *)
                       implicitNets.
                       super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_;
            pSVar19 != local_1b8; pSVar19 = (SyntaxNode *)&pSVar19->parent) {
          pSVar14 = *(Symbol **)pSVar19;
          local_1f0 = parsing::Token::valueText((Token *)&pSVar14->location);
          hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &implicitNetNames.super_Storage.field_0x88,&local_1f0);
          pos0 = (Scope *)(hash >> (implicitNetNames._144_1_ & 0x3f));
          lVar17 = (hash & 0xff) * 4;
          uVar21 = (&UNK_004a00ac)[lVar17];
          uVar22 = (&UNK_004a00ad)[lVar17];
          uVar23 = (&UNK_004a00ae)[lVar17];
          uVar24 = (&UNK_004a00af)[lVar17];
          uVar13 = 0;
          pSVar16 = pos0;
          uVar25 = uVar21;
          uVar26 = uVar22;
          uVar27 = uVar23;
          uVar28 = uVar24;
          uVar29 = uVar21;
          uVar30 = uVar22;
          uVar31 = uVar23;
          uVar32 = uVar24;
          uVar33 = uVar21;
          uVar34 = uVar22;
          uVar35 = uVar23;
          uVar36 = uVar24;
          do {
            pcVar1 = (char *)(implicitNetNames._160_8_ + (long)pSVar16 * 0x10);
            local_148 = *pcVar1;
            uStack_147 = pcVar1[1];
            uStack_146 = pcVar1[2];
            uStack_145 = pcVar1[3];
            uStack_144 = pcVar1[4];
            uStack_143 = pcVar1[5];
            uStack_142 = pcVar1[6];
            uStack_141 = pcVar1[7];
            uStack_140 = pcVar1[8];
            uStack_13f = pcVar1[9];
            uStack_13e = pcVar1[10];
            uStack_13d = pcVar1[0xb];
            uStack_13c = pcVar1[0xc];
            uStack_13b = pcVar1[0xd];
            uStack_13a = pcVar1[0xe];
            uVar9 = pcVar1[0xf];
            auVar20[0] = -(local_148 == uVar21);
            auVar20[1] = -(uStack_147 == uVar22);
            auVar20[2] = -(uStack_146 == uVar23);
            auVar20[3] = -(uStack_145 == uVar24);
            auVar20[4] = -(uStack_144 == uVar25);
            auVar20[5] = -(uStack_143 == uVar26);
            auVar20[6] = -(uStack_142 == uVar27);
            auVar20[7] = -(uStack_141 == uVar28);
            auVar20[8] = -(uStack_140 == uVar29);
            auVar20[9] = -(uStack_13f == uVar30);
            auVar20[10] = -(uStack_13e == uVar31);
            auVar20[0xb] = -(uStack_13d == uVar32);
            auVar20[0xc] = -(uStack_13c == uVar33);
            auVar20[0xd] = -(uStack_13b == uVar34);
            auVar20[0xe] = -(uStack_13a == uVar35);
            auVar20[0xf] = -(uVar9 == uVar36);
            uVar10 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
            uStack_139 = uVar9;
            if (uVar10 != 0) {
              lVar18 = implicitNetNames._160_8_ + (long)pSVar16 * 0x10;
              lVar17 = implicitNetNames._168_8_ + (long)pSVar16 * 0xf0;
              local_1d0 = pSVar16;
              local_1c8 = pSVar14;
              local_1c0 = uVar13;
              local_158 = uVar21;
              uStack_157 = uVar22;
              uStack_156 = uVar23;
              uStack_155 = uVar24;
              uStack_154 = uVar25;
              uStack_153 = uVar26;
              uStack_152 = uVar27;
              uStack_151 = uVar28;
              uStack_150 = uVar29;
              uStack_14f = uVar30;
              uStack_14e = uVar31;
              uStack_14d = uVar32;
              uStack_14c = uVar33;
              uStack_14b = uVar34;
              uStack_14a = uVar35;
              uStack_149 = uVar36;
              do {
                iVar7 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                  }
                }
                pSVar14 = (Symbol *)&local_1f0;
                bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)&implicitNetNames.super_Storage.field_0x88,
                                   (basic_string_view<char,_std::char_traits<char>_> *)pSVar14,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   ((ulong)(uint)(iVar7 << 4) + lVar17));
                if (bVar8) goto LAB_002d1bbe;
                uVar10 = uVar10 - 1 & uVar10;
              } while (uVar10 != 0);
              uVar9 = *(byte *)(lVar18 + 0xf);
              uVar13 = local_1c0;
              pSVar14 = local_1c8;
              pSVar16 = local_1d0;
              uVar21 = local_158;
              uVar22 = uStack_157;
              uVar23 = uStack_156;
              uVar24 = uStack_155;
              uVar25 = uStack_154;
              uVar26 = uStack_153;
              uVar27 = uStack_152;
              uVar28 = uStack_151;
              uVar29 = uStack_150;
              uVar30 = uStack_14f;
              uVar31 = uStack_14e;
              uVar32 = uStack_14d;
              uVar33 = uStack_14c;
              uVar34 = uStack_14b;
              uVar35 = uStack_14a;
              uVar36 = uStack_149;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & uVar9) == 0) break;
            lVar17 = uVar13 + 1;
            uVar13 = uVar13 + 1;
            pSVar16 = (Scope *)((long)&pSVar16->compilation + lVar17 & implicitNetNames._152_8_);
          } while (uVar13 <= (ulong)implicitNetNames._152_8_);
          if ((ulong)implicitNetNames._184_8_ < (ulong)implicitNetNames._176_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
            ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                      ((locator *)local_170,
                       (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                        *)&implicitNetNames.super_Storage.field_0x88,(size_t)pos0,hash,&local_1f0);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
            ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                      ((locator *)local_170,
                       (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                        *)&implicitNetNames.super_Storage.field_0x88,hash,&local_1f0);
          }
          local_170[0] = NetSymbol::createImplicit
                                   ((Compilation *)local_1d8,(IdentifierNameSyntax *)pSVar14,netType
                                   );
          pSVar14 = (Symbol *)local_170;
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)implicitSymbols,
                     (Symbol **)pSVar14);
LAB_002d1bbe:
        }
        SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::cleanup
                  (&implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>,
                   (EVP_PKEY_CTX *)pSVar14);
      }
    }
    else if (args_00->kind == Specparam) {
      implicitNets.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
           (pointer)BumpAllocator::
                    emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                              (&local_1e0->super_BumpAllocator,args_00);
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)implicitSymbols,
                 (Symbol **)&implicitNets);
    }
    ppSVar15 = &args_00->nextInScope;
  } while( true );
}

Assistant:

SpecifyBlockSymbol& SpecifyBlockSymbol::fromSyntax(const Scope& scope,
                                                   const SpecifyBlockSyntax& syntax,
                                                   SmallVector<const Symbol*>& implicitSymbols) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SpecifyBlockSymbol>(comp, syntax.specify.location());
    result->setSyntax(syntax);

    for (auto member : syntax.items)
        result->addMembers(*member);

    SmallSet<std::string_view, 8> implicitNetNames;

    for (auto member = result->getFirstMember(); member; member = member->getNextSibling()) {
        if (member->kind == SymbolKind::Specparam) {
            // specparams inside specify blocks get visibility in the parent scope as well.
            implicitSymbols.push_back(comp.emplace<TransparentMemberSymbol>(*member));
        }
        else if (member->kind == SymbolKind::SystemTimingCheck) {
            // some system timing checks can create implicit nets
            auto& timingCheck = member->as<SystemTimingCheckSymbol>();
            createImplicitNets(timingCheck, timingCheck.def, scope, implicitSymbols,
                               implicitNetNames);
        }
    }

    return *result;
}